

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O1

void phyr::latinHypercube(double *sample,int nSamples,int nDimensions,RNG *rng)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  
  uVar6 = (ulong)(uint)nDimensions;
  if (0 < nSamples) {
    uVar2 = *(ulong *)rng;
    lVar1 = *(long *)(rng + 8);
    uVar8 = 0;
    pdVar7 = sample;
    do {
      if (0 < nDimensions) {
        uVar11 = 0;
        do {
          uVar12 = (uint)(uVar2 >> 0x2d) ^ (uint)(uVar2 >> 0x1b);
          bVar3 = (byte)(uVar2 >> 0x3b);
          uVar2 = uVar2 * 0x5851f42d4c957f2d + lVar1;
          dVar13 = (double)((float)(uVar12 >> bVar3 | uVar12 << 0x20 - bVar3) * 2.3283064e-10);
          if (0.9999999999999999 <= dVar13) {
            dVar13 = 0.9999999999999999;
          }
          dVar14 = (dVar13 + (double)(int)uVar8) * (1.0 / (double)nSamples);
          dVar13 = 0.9999999999999999;
          if (dVar14 <= 0.9999999999999999) {
            dVar13 = dVar14;
          }
          pdVar7[uVar11] = dVar13;
          uVar11 = uVar11 + 1;
        } while (uVar6 != uVar11);
        *(ulong *)rng = uVar2;
      }
      uVar8 = uVar8 + 1;
      pdVar7 = pdVar7 + uVar6;
    } while (uVar8 != (uint)nSamples);
  }
  if (0 < nDimensions) {
    uVar2 = *(ulong *)rng;
    lVar1 = *(long *)(rng + 8);
    uVar8 = 0;
    do {
      if (0 < nSamples) {
        uVar11 = 0;
        do {
          uVar12 = nSamples - (int)uVar11;
          uVar5 = (ulong)-uVar12 % (ulong)uVar12;
          do {
            uVar9 = (uint)(uVar2 >> 0x2d) ^ (uint)(uVar2 >> 0x1b);
            bVar3 = (byte)(uVar2 >> 0x3b);
            uVar10 = uVar9 >> bVar3 | uVar9 << 0x20 - bVar3;
            uVar9 = (uint)((ulong)-uVar12 % (ulong)uVar12);
            if (uVar9 <= uVar10) {
              uVar5 = (ulong)uVar10 % (ulong)uVar12;
            }
            uVar2 = uVar2 * 0x5851f42d4c957f2d + lVar1;
          } while (uVar10 < uVar9);
          iVar4 = ((int)uVar5 + (int)uVar11) * nDimensions + (int)uVar8;
          dVar13 = sample[uVar8 + uVar11 * uVar6];
          sample[uVar8 + uVar11 * uVar6] = sample[iVar4];
          sample[iVar4] = dVar13;
          uVar11 = uVar11 + 1;
        } while (uVar11 != (uint)nSamples);
        *(ulong *)rng = uVar2;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar6);
  }
  return;
}

Assistant:

void latinHypercube(Real* sample, int nSamples, int nDimensions, RNG& rng) {
    // Generate LHS samples along the diagonal
    Real invSamples = Real(1) / nSamples;
    for (int i = 0; i < nSamples; i++) {
        for (int j = 0; j < nDimensions; j++) {
            Real offset = (i + rng.uniformReal()) * invSamples;
            sample[nDimensions * i + j] = std::min(offset, OneMinusEpsilon);
        }
    }

    // Permute LHS samples in each dimension
    for (int i = 0; i < nDimensions; i++) {
        for (int j = 0; j < nSamples; j++) {
            int swapIdx = j + rng.uniformUInt32(nSamples - j);
            std::swap(sample[nDimensions * j + i], sample[nDimensions * swapIdx + i]);
        }
    }
}